

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O0

int main(void)

{
  parameter_type P;
  parameter_type P_00;
  parameter_type P_01;
  parameter_type P_02;
  parameter_type P_03;
  parameter_type P_04;
  parameter_type P_05;
  parameter_type P_06;
  exception *err;
  lagfib2plus_19937_64 r_19;
  lagfib4plus_19937_64 r_18;
  lagfib4xor_19937_64 r_17;
  lagfib2xor_19937_64 r_16;
  mt19937_64 r_15;
  mt19937 r_14;
  yarn5s r_13;
  yarn5 r_12;
  yarn4 r_11;
  yarn3s r_10;
  yarn3 r_9;
  yarn2 r_8;
  mrg5s r_7;
  mrg5 r_6;
  mrg4 r_5;
  mrg3s r_4;
  mrg3 r_3;
  mrg2 r_2;
  lcg64_shift r_1;
  lcg64 r;
  yarn2 *in_stack_ffffffffffefe5f8;
  parameter_type in_stack_ffffffffffefe600;
  undefined4 in_stack_ffffffffffefe608;
  int in_stack_ffffffffffefe60c;
  yarn5s *in_stack_ffffffffffefe610;
  allocator *r_20;
  allocator aStack_c1911;
  string asStack_c1910 [262191];
  allocator aStack_818e1;
  string asStack_818e0 [262191];
  allocator aStack_418b1;
  string asStack_418b0 [262191];
  allocator local_1881;
  string local_1880 [2551];
  allocator local_e89;
  string local_e88 [2543];
  allocator local_499;
  string local_498 [79];
  allocator local_449;
  string local_448 [79];
  allocator local_3f9;
  string local_3f8 [32];
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  allocator local_399;
  string local_398 [32];
  undefined8 local_378;
  undefined4 local_370;
  undefined8 local_368;
  undefined4 local_360;
  allocator local_341;
  string local_340 [32];
  undefined8 local_320;
  undefined4 local_318;
  undefined8 local_310;
  undefined4 local_308;
  allocator local_2e9;
  string local_2e8 [32];
  undefined8 local_2c8;
  allocator local_2a9;
  string local_2a8 [79];
  allocator local_259;
  string local_258 [79];
  allocator local_209;
  string local_208 [32];
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  allocator local_1a9;
  string local_1a8 [32];
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_178;
  undefined4 local_170;
  allocator local_151;
  string local_150 [32];
  undefined8 local_130;
  undefined4 local_128;
  undefined8 local_120;
  undefined4 local_118;
  allocator local_f9;
  string local_f8 [32];
  undefined8 local_d8;
  allocator local_b9;
  string local_b8 [32];
  undefined8 local_98;
  undefined8 uStack_90;
  allocator local_69;
  string local_68 [48];
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_4;
  
  local_4 = 0;
  local_38 = trng::lcg64::Default;
  uStack_30 = DAT_001100f8;
  P.b = (result_type)in_stack_ffffffffffefe600.a;
  P.a = (result_type)in_stack_ffffffffffefe5f8;
  trng::lcg64::lcg64((lcg64 *)0x102951,P);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"trng::lcg64",&local_69);
  sample_output<trng::lcg64>
            ((lcg64 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_98 = trng::lcg64_shift::Default;
  uStack_90 = DAT_00110138;
  P_00.b._0_4_ = in_stack_ffffffffffefe600.a[0];
  P_00.b._4_4_ = in_stack_ffffffffffefe600.a[1];
  P_00.a = (result_type)in_stack_ffffffffffefe5f8;
  trng::lcg64_shift::lcg64_shift((lcg64_shift *)0x1029e6,P_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"trng::lcg64_shift",&local_b9);
  sample_output<trng::lcg64_shift>
            ((lcg64_shift *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_d8 = trng::mrg2::LEcuyer1;
  trng::mrg2::mrg2((mrg2 *)in_stack_ffffffffffefe5f8,(parameter_type)in_stack_ffffffffffefe600.a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"trng::mrg2",&local_f9);
  sample_output<trng::mrg2>
            ((mrg2 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_118 = DAT_00110188;
  local_120 = trng::mrg3::LEcuyer1;
  local_128 = DAT_00110188;
  local_130 = trng::mrg3::LEcuyer1;
  P_03.a._4_8_ = in_stack_ffffffffffefe610;
  P_03.a[0] = in_stack_ffffffffffefe60c;
  trng::mrg3::mrg3((mrg3 *)0x102b2f,P_03);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"trng::mrg3",&local_151);
  sample_output<trng::mrg3>
            ((mrg3 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  local_170 = DAT_001101ac;
  local_178 = trng::mrg3s::trng0;
  local_180 = DAT_001101ac;
  local_188 = trng::mrg3s::trng0;
  P_04.a._4_8_ = in_stack_ffffffffffefe610;
  P_04.a[0] = in_stack_ffffffffffefe60c;
  trng::mrg3s::mrg3s((mrg3s *)0x102beb,P_04);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"trng::mrg3s",&local_1a9);
  sample_output<trng::mrg3s>
            ((mrg3s *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  local_1e8 = trng::mrg4::LEcuyer1;
  uStack_1e0 = DAT_001101c4;
  P_01.a[2] = in_stack_ffffffffffefe600.a[0];
  P_01.a[3] = in_stack_ffffffffffefe600.a[1];
  P_01.a._0_8_ = in_stack_ffffffffffefe5f8;
  trng::mrg4::mrg4((mrg4 *)0x102c80,P_01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"trng::mrg4",&local_209);
  sample_output<trng::mrg4>
            ((mrg4 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  trng::mrg5::mrg5((mrg5 *)in_stack_ffffffffffefe600.a,(parameter_type *)in_stack_ffffffffffefe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"trng::mrg5",&local_259);
  sample_output<trng::mrg5>
            ((mrg5 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  trng::mrg5s::mrg5s((mrg5s *)in_stack_ffffffffffefe600.a,
                     (parameter_type *)in_stack_ffffffffffefe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"trng::mrg5s",&local_2a9);
  sample_output<trng::mrg5s>
            ((mrg5s *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  local_2c8 = trng::yarn2::LEcuyer1;
  trng::yarn2::yarn2(in_stack_ffffffffffefe5f8,in_stack_ffffffffffefe600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"trng::yarn2",&local_2e9);
  sample_output<trng::yarn2>
            ((yarn2 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  local_308 = DAT_00170230;
  local_310 = trng::yarn3::LEcuyer1;
  local_318 = DAT_00170230;
  local_320 = trng::yarn3::LEcuyer1;
  P_05.a._4_8_ = in_stack_ffffffffffefe610;
  P_05.a[0] = in_stack_ffffffffffefe60c;
  trng::yarn3::yarn3((yarn3 *)0x102eb1,P_05);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"trng::yarn3",&local_341);
  sample_output<trng::yarn3>
            ((yarn3 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  local_360 = DAT_001d0254;
  local_368 = trng::yarn3s::trng0;
  local_370 = DAT_001d0254;
  local_378 = trng::yarn3s::trng0;
  P_06.a._4_8_ = in_stack_ffffffffffefe610;
  P_06.a[0] = in_stack_ffffffffffefe60c;
  trng::yarn3s::yarn3s((yarn3s *)0x102f67,P_06);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"trng::yarn3s",&local_399);
  sample_output<trng::yarn3s>
            ((yarn3s *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  local_3d8 = trng::yarn4::LEcuyer1;
  uStack_3d0 = DAT_0023026c;
  P_02.a[2] = in_stack_ffffffffffefe600.a[0];
  P_02.a[3] = in_stack_ffffffffffefe600.a[1];
  P_02.a._0_8_ = in_stack_ffffffffffefe5f8;
  trng::yarn4::yarn4((yarn4 *)0x102ff6,P_02);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"trng::yarn4",&local_3f9);
  sample_output<trng::yarn4>
            ((yarn4 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  trng::yarn5::yarn5((yarn5 *)in_stack_ffffffffffefe600.a,
                     (parameter_type *)in_stack_ffffffffffefe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"trng::yarn5",&local_449);
  sample_output<trng::yarn5>
            ((yarn5 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  trng::yarn5s::yarn5s
            ((yarn5s *)in_stack_ffffffffffefe600.a,(parameter_type *)in_stack_ffffffffffefe5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_498,"trng::yarn5s",&local_499);
  sample_output<trng::yarn5s>
            (in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  trng::mt19937::mt19937((mt19937 *)in_stack_ffffffffffefe600.a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e88,"trng::mt19937",&local_e89);
  sample_output<trng::mt19937>
            ((mt19937 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  trng::mt19937_64::mt19937_64((mt19937_64 *)in_stack_ffffffffffefe600.a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1880,"trng::mt19937_64",&local_1881);
  sample_output<trng::mt19937_64>
            ((mt19937_64 *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(local_1880);
  std::allocator<char>::~allocator((allocator<char> *)&local_1881);
  trng::lagfib2xor<unsigned_long,_9842U,_19937U>::lagfib2xor
            ((lagfib2xor<unsigned_long,_9842U,_19937U> *)in_stack_ffffffffffefe600.a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_418b0,"trng::lagfib2xor_19937_64",&aStack_418b1);
  sample_output<trng::lagfib2xor<unsigned_long,9842u,19937u>>
            ((lagfib2xor<unsigned_long,_9842U,_19937U> *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(asStack_418b0);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_418b1);
  trng::lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U>::lagfib4xor
            ((lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)in_stack_ffffffffffefe600.a)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_818e0,"trng::lagfib4xor_19937_64",&aStack_818e1);
  sample_output<trng::lagfib4xor<unsigned_long,3860u,7083u,11580u,19937u>>
            ((lagfib4xor<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(asStack_818e0);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_818e1);
  trng::lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U>::lagfib4plus
            ((lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)in_stack_ffffffffffefe600.a
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string(asStack_c1910,"trng::lagfib2plus_19937_64",&aStack_c1911);
  sample_output<trng::lagfib4plus<unsigned_long,3860u,7083u,11580u,19937u>>
            ((lagfib4plus<unsigned_long,_3860U,_7083U,_11580U,_19937U> *)in_stack_ffffffffffefe610,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string(asStack_c1910);
  std::allocator<char>::~allocator((allocator<char> *)&aStack_c1911);
  trng::lagfib2plus<unsigned_long,_9842U,_19937U>::lagfib2plus
            ((lagfib2plus<unsigned_long,_9842U,_19937U> *)in_stack_ffffffffffefe600.a);
  r_20 = (allocator *)&stack0xffffffffffefe6bf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffefe6c0,"trng::lagfib4plus_19937_64",r_20)
  ;
  sample_output<trng::lagfib2plus<unsigned_long,9842u,19937u>>
            ((lagfib2plus<unsigned_long,_9842U,_19937U> *)r_20,
             (string *)CONCAT44(in_stack_ffffffffffefe60c,in_stack_ffffffffffefe608));
  std::__cxx11::string::~string((string *)&stack0xffffffffffefe6c0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffefe6bf);
  return 0;
}

Assistant:

int main() {
  try {
    {
      trng::lcg64 r;
      sample_output(r, "trng::lcg64");
    }
    {
      trng::lcg64_shift r;
      sample_output(r, "trng::lcg64_shift");
    }
    {
      trng::mrg2 r;
      sample_output(r, "trng::mrg2");
    }
    {
      trng::mrg3 r;
      sample_output(r, "trng::mrg3");
    }
    {
      trng::mrg3s r;
      sample_output(r, "trng::mrg3s");
    }
    {
      trng::mrg4 r;
      sample_output(r, "trng::mrg4");
    }
    {
      trng::mrg5 r;
      sample_output(r, "trng::mrg5");
    }
    {
      trng::mrg5s r;
      sample_output(r, "trng::mrg5s");
    }
    {
      trng::yarn2 r;
      sample_output(r, "trng::yarn2");
    }
    {
      trng::yarn3 r;
      sample_output(r, "trng::yarn3");
    }
    {
      trng::yarn3s r;
      sample_output(r, "trng::yarn3s");
    }
    {
      trng::yarn4 r;
      sample_output(r, "trng::yarn4");
    }
    {
      trng::yarn5 r;
      sample_output(r, "trng::yarn5");
    }
    {
      trng::yarn5s r;
      sample_output(r, "trng::yarn5s");
    }
    {
      trng::mt19937 r;
      sample_output(r, "trng::mt19937");
    }
    {
      trng::mt19937_64 r;
      sample_output(r, "trng::mt19937_64");
    }
    {
      trng::lagfib2xor_19937_64 r;
      sample_output(r, "trng::lagfib2xor_19937_64");
    }
    {
      trng::lagfib4xor_19937_64 r;
      sample_output(r, "trng::lagfib4xor_19937_64");
    }
    {
      trng::lagfib4plus_19937_64 r;
      sample_output(r, "trng::lagfib2plus_19937_64");
    }
    {
      trng::lagfib2plus_19937_64 r;
      sample_output(r, "trng::lagfib4plus_19937_64");
    }
  } catch (std::exception &err) {
    std::cerr << err.what() << std::endl;
  } catch (...) {
    std::cerr << "something went wrong" << std::endl;
  }
  return EXIT_SUCCESS;
}